

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tournser.cpp
# Opt level: O2

string * toBinary_abi_cxx11_(string *__return_storage_ptr__,int num,int bits)

{
  int iVar1;
  allocator_type local_59;
  vector<char,_std::allocator<char>_> digits;
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>_>
  local_40;
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>_>
  local_38;
  
  std::vector<char,_std::allocator<char>_>::vector(&digits,(long)bits,&local_59);
  iVar1 = 0;
  if (0 < bits) {
    iVar1 = bits;
  }
  while (iVar1 != 0) {
    local_59 = (allocator_type)((char)(num % 2) + '0');
    std::vector<char,_std::allocator<char>_>::emplace_back<char>(&digits,(char *)&local_59);
    num = num >> 1;
    iVar1 = iVar1 + -1;
  }
  local_38.current._M_current =
       (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
       (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
       digits.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  local_40.current._M_current =
       (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
       (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
       digits.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
       _M_start;
  std::__cxx11::string::
  string<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>,void>
            ((string *)__return_storage_ptr__,&local_38,&local_40,&local_59);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&digits.super__Vector_base<char,_std::allocator<char>_>);
  return __return_storage_ptr__;
}

Assistant:

std::string toBinary(int num, int bits) {
    std::vector<char> digits(bits);
    for (int i = 0; i < bits; ++i) {
        digits.push_back(num % 2 + '0');
        num >>= 1;
    }
    return std::string(digits.rbegin(), digits.rend());
}